

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O3

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::StartReceiverReport
          (RTCPCompoundPacketBuilder *this,uint32_t senderssrc)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  
  iVar3 = -0x2a;
  if ((this->arebuilding == true) && (iVar3 = -0x21, (this->report).headerlength == 0)) {
    sVar1 = this->appsize;
    sVar2 = this->byesize;
    sVar4 = SDES::NeededBytes(&this->sdes);
    iVar3 = -0x2b;
    if (7 < this->maximumpacketsize - (sVar4 + sVar1 + sVar2)) {
      (this->report).headerlength = 4;
      (this->report).isSR = false;
      *(uint32_t *)(this->report).headerdata =
           senderssrc >> 0x18 | (senderssrc & 0xff0000) >> 8 | (senderssrc & 0xff00) << 8 |
           senderssrc << 0x18;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int RTCPCompoundPacketBuilder::StartReceiverReport(uint32_t senderssrc)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (report.headerlength != 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYGOTREPORT;

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalsize = byesize+appsize+sdes.NeededBytes();
#else
	size_t totalsize = byesize+appsize+unknownsize+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sizeleft = maximumpacketsize-totalsize;
	size_t neededsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t);
	
	if (neededsize > sizeleft)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;
	
	// fill in some things

	report.headerlength = sizeof(uint32_t);
	report.isSR = false;
	
	uint32_t *ssrc = (uint32_t *)report.headerdata;
	*ssrc = htonl(senderssrc);

	return 0;
}